

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O2

void anon_unknown.dwarf_512401::init_curious_service(Caliper *c,Channel *channel)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Events *pEVar2;
  ostream *poVar3;
  string local_298;
  Attribute subscribe_attr;
  Variant v_true;
  value_type local_260;
  value_type local_240;
  Log local_220;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"subscription_event",(allocator<char> *)&local_298);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[2])
                    (c,&local_220);
  subscribe_attr.m_node = (Node *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string((string *)&local_220);
  v_true.m_v.type_and_size = 7;
  v_true.m_v.value.v_uint = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"io.region",(allocator<char> *)&local_298);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,&local_220,4,0x14,1,&subscribe_attr,&v_true);
  (anonymous_namespace)::io_region_attr = CONCAT44(extraout_var_00,iVar1);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"io.filesystem",(allocator<char> *)&local_298);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,&local_220,4,0x54,0,0,0);
  (anonymous_namespace)::io_filesystem_attr = CONCAT44(extraout_var_01,iVar1);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"io.mount.point",(allocator<char> *)&local_298);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,&local_220,4,0x54,0,0,0);
  (anonymous_namespace)::io_mount_point_attr = CONCAT44(extraout_var_02,iVar1);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"io.bytes.read",(allocator<char> *)&local_298);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,&local_220,3,0x815,0,0,0);
  _ZN12_GLOBAL__N_118io_bytes_read_attrE_0 = CONCAT44(extraout_var_03,iVar1);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"io.bytes.written",(allocator<char> *)&local_298);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,&local_220,3,0x815,0,0,0);
  _ZN12_GLOBAL__N_121io_bytes_written_attrE_0 = CONCAT44(extraout_var_04,iVar1);
  std::__cxx11::string::~string((string *)&local_220);
  pEVar2 = cali::Channel::events(channel);
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240.super__Function_base._M_functor._M_unused._M_object = init_curious_in_channel;
  local_240._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->post_init_evt).mCb,&local_240);
  std::_Function_base::~_Function_base(&local_240.super__Function_base);
  pEVar2 = cali::Channel::events(channel);
  local_260.super__Function_base._M_functor._8_8_ = 0;
  local_260.super__Function_base._M_functor._M_unused._M_object = finalize_curious_in_channel;
  local_260._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_invoke;
  local_260.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->pre_finish_evt).mCb,&local_260);
  std::_Function_base::~_Function_base(&local_260.super__Function_base);
  std::ofstream::ofstream(&local_220);
  local_220.m_level = 1;
  poVar3 = cali::Log::stream(&local_220);
  cali::Channel::name_abi_cxx11_(&local_298,channel);
  poVar3 = std::operator<<(poVar3,(string *)&local_298);
  poVar3 = std::operator<<(poVar3,": Registered io service");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_298);
  std::ofstream::~ofstream(&local_220);
  return;
}

Assistant:

void init_curious_service(Caliper* c, Channel* channel)
{
    Attribute subscribe_attr = c->get_attribute("subscription_event");
    Variant   v_true(true);

    // create I/O attributes
    io_region_attr =
        c->create_attribute("io.region", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD, 1, &subscribe_attr, &v_true);
    io_filesystem_attr =
        c->create_attribute("io.filesystem", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD | CALI_ATTR_SKIP_EVENTS);
    io_mount_point_attr =
        c->create_attribute("io.mount.point", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD | CALI_ATTR_SKIP_EVENTS);

    io_bytes_read_attr = c->create_attribute(
        "io.bytes.read",
        CALI_TYPE_UINT,
        CALI_ATTR_SCOPE_THREAD | CALI_ATTR_ASVALUE | CALI_ATTR_AGGREGATABLE
    );
    io_bytes_written_attr = c->create_attribute(
        "io.bytes.written",
        CALI_TYPE_UINT,
        CALI_ATTR_SCOPE_THREAD | CALI_ATTR_ASVALUE | CALI_ATTR_AGGREGATABLE
    );

    // register Caliper post_init_evt and finish_evt callbacks
    channel->events().post_init_evt.connect(init_curious_in_channel);

    // finish_evt: unregister channel from curious (??)
    channel->events().pre_finish_evt.connect(finalize_curious_in_channel);

    Log(1).stream() << channel->name() << ": Registered io service" << std::endl;
}